

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualStringMappedVector.hpp
# Opt level: O2

optional<unsigned_long> __thiscall
gmlc::containers::
DualStringMappedVector<helics::Publication,helics::InterfaceHandle,(reference_stability)0,5>::
insert<helics::ValueFederate*&,helics::InterfaceHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
          (DualStringMappedVector<helics::Publication,helics::InterfaceHandle,(reference_stability)0,5>
           *this,key_type *param_2,ValueFederate **param_3,InterfaceHandle *param_4,
          basic_string_view<char,_std::char_traits<char>_> *param_5,
          basic_string_view<char,_std::char_traits<char>_> *param_6,
          basic_string_view<char,_std::char_traits<char>_> *param_7)

{
  undefined8 uVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>,_bool> pVar2
  ;
  optional<unsigned_long> oVar3;
  size_t index;
  _Storage<unsigned_long,_true> local_38;
  
  local_38 = (_Storage<unsigned_long,_true>)
             std::
             _Rb_tree<helics::InterfaceHandle,_std::pair<const_helics::InterfaceHandle,_unsigned_long>,_std::_Select1st<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
             ::find((_Rb_tree<helics::InterfaceHandle,_std::pair<const_helics::InterfaceHandle,_unsigned_long>,_std::_Select1st<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
                     *)(this + 0x98),param_2);
  if ((_Base_ptr)local_38._M_value == (_Base_ptr)(this + 0xa0)) {
    local_38 = *(_Storage<unsigned_long,_true> *)this;
    StableBlockVector<helics::Publication,5u,std::allocator<helics::Publication>>::
    emplace_back<helics::ValueFederate*&,helics::InterfaceHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
              ((StableBlockVector<helics::Publication,5u,std::allocator<helics::Publication>> *)this
               ,param_3,param_4,param_5,param_6,param_7);
    pVar2 = std::
            _Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,unsigned_long>,std::_Select1st<std::pair<helics::InterfaceHandle_const,unsigned_long>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,unsigned_long>>>
            ::_M_emplace_unique<helics::InterfaceHandle_const&,unsigned_long&>
                      ((_Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,unsigned_long>,std::_Select1st<std::pair<helics::InterfaceHandle_const,unsigned_long>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,unsigned_long>>>
                        *)(this + 0x98),param_2,&local_38._M_value);
    uVar1 = CONCAT71(pVar2._9_7_,1);
  }
  else {
    uVar1 = 0;
  }
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar1;
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_38._M_value;
  return (optional<unsigned_long>)
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> insert(
            no_search_type /*searchValue1*/,
            const searchType2& searchValue2,
            Us&&... data)
        {
            auto fnd = lookup2.find(searchValue2);
            if (fnd != lookup2.end()) {
                return std::nullopt;
            }
            auto index = dataStorage.size();
            dataStorage.emplace_back(std::forward<Us>(data)...);
            lookup2.emplace(searchValue2, index);
            return index;
        }